

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O0

shared_ptr<spdlog::logger>
spdlog::stdout_logger_mt<spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>>
          (string *logger_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  string *in_stack_00000068;
  element_type *this;
  string local_40 [64];
  
  this = in_RDI;
  std::__cxx11::string::string(local_40,in_RSI);
  async_factory_impl<(spdlog::async_overflow_policy)0>::
  create<spdlog::sinks::stdout_sink<spdlog::details::console_mutex>>(in_stack_00000068);
  std::shared_ptr<spdlog::logger>::shared_ptr<spdlog::async_logger,void>
            ((shared_ptr<spdlog::logger> *)this,(shared_ptr<spdlog::async_logger> *)in_RDI);
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x284127);
  std::__cxx11::string::~string(local_40);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stdout_logger_mt(const std::string &logger_name) {
    return Factory::template create<sinks::stdout_sink_mt>(logger_name);
}